

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

void __thiscall VkSpecParser::parseFeature(VkSpecParser *this)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  bool isVulkan;
  QXmlStreamAttribute *attr;
  QXmlStreamAttributes *__range1;
  char16_t *str_4;
  char16_t *str_3;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  iterator __end1;
  iterator __begin1;
  QString versionName;
  QString api;
  undefined1 in_stack_fffffffffffffcd8;
  byte in_stack_fffffffffffffcd9;
  undefined1 in_stack_fffffffffffffcda;
  undefined1 uVar6;
  byte in_stack_fffffffffffffcdb;
  undefined1 in_stack_fffffffffffffcdc;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffffcdd;
  byte in_stack_fffffffffffffcde;
  byte in_stack_fffffffffffffcdf;
  undefined6 in_stack_fffffffffffffce8;
  byte in_stack_fffffffffffffcee;
  byte in_stack_fffffffffffffcef;
  undefined4 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf4;
  undefined1 in_stack_fffffffffffffcf5;
  undefined1 in_stack_fffffffffffffcf6;
  byte bVar8;
  undefined1 in_stack_fffffffffffffcf7;
  QArrayDataPointer<char16_t> *versionDefine;
  char16_t *in_stack_fffffffffffffd10;
  QArrayDataPointer<char16_t> local_278 [2];
  undefined1 local_238 [16];
  QArrayDataPointer<char16_t> local_228 [2];
  undefined1 local_1e8 [16];
  QArrayDataPointer<char16_t> local_1d8 [2];
  QChar local_1a2;
  undefined1 local_1a0 [24];
  QStringView local_188;
  QArrayDataPointer<char16_t> local_148 [2];
  QStringView local_108;
  QStringView local_f8;
  QArrayDataPointer<char16_t> local_b8 [2];
  QStringView local_78;
  QXmlStreamAttribute *local_68;
  iterator local_60;
  iterator local_58 [4];
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  versionDefine = in_RDI;
  QString::QString((QString *)0x1032f5);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x10332f);
  QXmlStreamReader::attributes();
  local_58[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_58[0] = QList<QXmlStreamAttribute>::begin((QList<QXmlStreamAttribute> *)in_RDI);
  local_60.i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_60 = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)in_RDI);
  while( true ) {
    local_68 = local_60.i;
    bVar1 = QList<QXmlStreamAttribute>::iterator::operator!=(local_58,local_60);
    if (!bVar1) break;
    QList<QXmlStreamAttribute>::iterator::operator*(local_58);
    local_78 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x103409);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_b8,(Data *)0x0,L"api",3);
    QString::QString((QString *)in_RDI,
                     (DataPointer *)
                     CONCAT17(in_stack_fffffffffffffcdf,
                              CONCAT16(in_stack_fffffffffffffcde,
                                       CONCAT15(in_stack_fffffffffffffcdd,
                                                CONCAT14(in_stack_fffffffffffffcdc,
                                                         CONCAT13(in_stack_fffffffffffffcdb,
                                                                  CONCAT12(in_stack_fffffffffffffcda
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffcd9,
                                                  in_stack_fffffffffffffcd8))))))));
    QStringView::QStringView<QString,_true>
              ((QStringView *)
               CONCAT17(in_stack_fffffffffffffcf7,
                        CONCAT16(in_stack_fffffffffffffcf6,
                                 CONCAT15(in_stack_fffffffffffffcf5,
                                          CONCAT14(in_stack_fffffffffffffcf4,
                                                   in_stack_fffffffffffffcf0)))),
               (QString *)
               CONCAT17(in_stack_fffffffffffffcef,
                        CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)));
    in_stack_fffffffffffffcdf =
         operator==((QStringView *)in_RDI,
                    (QStringView *)
                    CONCAT17(in_stack_fffffffffffffcdf,
                             CONCAT16(in_stack_fffffffffffffcde,
                                      CONCAT15(in_stack_fffffffffffffcdd,
                                               CONCAT14(in_stack_fffffffffffffcdc,
                                                        CONCAT13(in_stack_fffffffffffffcdb,
                                                                 CONCAT12(in_stack_fffffffffffffcda,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffcd9,
                                                  in_stack_fffffffffffffcd8))))))));
    QString::~QString((QString *)0x1034a7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    if ((in_stack_fffffffffffffcdf & 1) == 0) {
      local_108 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x103540);
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_148,(Data *)0x0,L"name",4);
      QString::QString((QString *)in_RDI,
                       (DataPointer *)
                       CONCAT17(in_stack_fffffffffffffcdf,
                                CONCAT16(in_stack_fffffffffffffcde,
                                         CONCAT15(in_stack_fffffffffffffcdd,
                                                  CONCAT14(in_stack_fffffffffffffcdc,
                                                           CONCAT13(in_stack_fffffffffffffcdb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffcda,
                                                  CONCAT11(in_stack_fffffffffffffcd9,
                                                           in_stack_fffffffffffffcd8))))))));
      QStringView::QStringView<QString,_true>
                ((QStringView *)
                 CONCAT17(in_stack_fffffffffffffcf7,
                          CONCAT16(in_stack_fffffffffffffcf6,
                                   CONCAT15(in_stack_fffffffffffffcf5,
                                            CONCAT14(in_stack_fffffffffffffcf4,
                                                     in_stack_fffffffffffffcf0)))),
                 (QString *)
                 CONCAT17(in_stack_fffffffffffffcef,
                          CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)));
      in_stack_fffffffffffffcde =
           operator==((QStringView *)in_RDI,
                      (QStringView *)
                      CONCAT17(in_stack_fffffffffffffcdf,
                               CONCAT16(in_stack_fffffffffffffcde,
                                        CONCAT15(in_stack_fffffffffffffcdd,
                                                 CONCAT14(in_stack_fffffffffffffcdc,
                                                          CONCAT13(in_stack_fffffffffffffcdb,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffcda,
                                                  CONCAT11(in_stack_fffffffffffffcd9,
                                                           in_stack_fffffffffffffcd8))))))));
      QString::~QString((QString *)0x1035ed);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
      if ((in_stack_fffffffffffffcde & 1) != 0) {
        local_188 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x10360e);
        QStringView::toString((QStringView *)in_RDI);
        QString::trimmed((QString *)
                         CONCAT17(in_stack_fffffffffffffcdf,
                                  CONCAT16(in_stack_fffffffffffffcde,
                                           CONCAT15(in_stack_fffffffffffffcdd,
                                                    CONCAT14(in_stack_fffffffffffffcdc,
                                                             CONCAT13(in_stack_fffffffffffffcdb,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffcda,
                                                  CONCAT11(in_stack_fffffffffffffcd9,
                                                           in_stack_fffffffffffffcd8))))))));
        QString::operator=((QString *)in_RDI,
                           (QString *)
                           CONCAT17(in_stack_fffffffffffffcdf,
                                    CONCAT16(in_stack_fffffffffffffcde,
                                             CONCAT15(in_stack_fffffffffffffcdd,
                                                      CONCAT14(in_stack_fffffffffffffcdc,
                                                               CONCAT13(in_stack_fffffffffffffcdb,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffcda,
                                                  CONCAT11(in_stack_fffffffffffffcd9,
                                                           in_stack_fffffffffffffcd8))))))));
        QString::~QString((QString *)0x10366a);
        QString::~QString((QString *)0x103677);
      }
    }
    else {
      local_f8 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1034c8);
      QStringView::toString((QStringView *)in_RDI);
      QString::trimmed((QString *)
                       CONCAT17(in_stack_fffffffffffffcdf,
                                CONCAT16(in_stack_fffffffffffffcde,
                                         CONCAT15(in_stack_fffffffffffffcdd,
                                                  CONCAT14(in_stack_fffffffffffffcdc,
                                                           CONCAT13(in_stack_fffffffffffffcdb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffcda,
                                                  CONCAT11(in_stack_fffffffffffffcd9,
                                                           in_stack_fffffffffffffcd8))))))));
      QString::operator=((QString *)in_RDI,
                         (QString *)
                         CONCAT17(in_stack_fffffffffffffcdf,
                                  CONCAT16(in_stack_fffffffffffffcde,
                                           CONCAT15(in_stack_fffffffffffffcdd,
                                                    CONCAT14(in_stack_fffffffffffffcdc,
                                                             CONCAT13(in_stack_fffffffffffffcdb,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffcda,
                                                  CONCAT11(in_stack_fffffffffffffcd9,
                                                           in_stack_fffffffffffffcd8))))))));
      QString::~QString((QString *)0x103524);
      QString::~QString((QString *)0x103531);
    }
    QList<QXmlStreamAttribute>::iterator::operator++(local_58);
  }
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1033d9);
  QChar::QChar<char,_true>(&local_1a2,',');
  QFlags<Qt::SplitBehaviorFlags>::QFlags
            ((QFlags<Qt::SplitBehaviorFlags> *)in_RDI,
             CONCAT13(in_stack_fffffffffffffcdf,
                      CONCAT12(in_stack_fffffffffffffcde,
                               CONCAT11(in_stack_fffffffffffffcdd,in_stack_fffffffffffffcdc))));
  QString::split((QChar)(char16_t)local_1a0,(QFlags *)&local_20,(uint)(ushort)local_1a2.ucs);
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_1d8,(Data *)0x0,L"vulkan",6);
  QString::QString((QString *)in_RDI,
                   (DataPointer *)
                   CONCAT17(in_stack_fffffffffffffcdf,
                            CONCAT16(in_stack_fffffffffffffcde,
                                     CONCAT15(in_stack_fffffffffffffcdd,
                                              CONCAT14(in_stack_fffffffffffffcdc,
                                                       CONCAT13(in_stack_fffffffffffffcdb,
                                                                CONCAT12(in_stack_fffffffffffffcda,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffcd9,
                                                  in_stack_fffffffffffffcd8))))))));
  bVar2 = QListSpecialMethods<QString>::contains
                    ((QListSpecialMethods<QString> *)
                     CONCAT17(in_stack_fffffffffffffcef,
                              CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)),
                     (QString *)in_RDI,
                     CONCAT13(in_stack_fffffffffffffcdf,
                              CONCAT12(in_stack_fffffffffffffcde,
                                       CONCAT11(in_stack_fffffffffffffcdd,in_stack_fffffffffffffcdc)
                                      )));
  QString::~QString((QString *)0x103768);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
  QList<QString>::~QList((QList<QString> *)0x103782);
  bVar3 = bVar2 & 1;
  while( true ) {
    bVar4 = QXmlStreamReader::atEnd();
    if (((bVar4 ^ 0xff) & 1) == 0) break;
    QXmlStreamReader::readNext();
    bVar1 = QXmlStreamReader::isEndElement((QXmlStreamReader *)0x1037c1);
    bVar8 = 0;
    bVar4 = 0;
    uVar7 = false;
    if (bVar1) {
      auVar5 = QXmlStreamReader::name();
      local_1e8 = auVar5;
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_228,(Data *)0x0,L"feature",7);
      bVar8 = 1;
      QString::QString((QString *)in_RDI,
                       (DataPointer *)
                       CONCAT17(in_stack_fffffffffffffcdf,
                                CONCAT16(in_stack_fffffffffffffcde,
                                         CONCAT15(bVar2,CONCAT14(uVar7,CONCAT13(
                                                  in_stack_fffffffffffffcdb,
                                                  CONCAT12(in_stack_fffffffffffffcda,
                                                           CONCAT11(in_stack_fffffffffffffcd9,
                                                                    in_stack_fffffffffffffcd8)))))))
                      );
      bVar4 = 1;
      QStringView::QStringView<QString,_true>
                ((QStringView *)
                 CONCAT17(bVar3,CONCAT16(bVar8,CONCAT15(1,CONCAT14(in_stack_fffffffffffffcf4,
                                                                   in_stack_fffffffffffffcf0)))),
                 (QString *)
                 CONCAT17(in_stack_fffffffffffffcef,
                          CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)));
      uVar7 = operator==((QStringView *)in_RDI,
                         (QStringView *)
                         CONCAT17(in_stack_fffffffffffffcdf,
                                  CONCAT16(in_stack_fffffffffffffcde,
                                           CONCAT15(bVar2,CONCAT14(uVar7,CONCAT13(
                                                  in_stack_fffffffffffffcdb,
                                                  CONCAT12(in_stack_fffffffffffffcda,
                                                           CONCAT11(in_stack_fffffffffffffcd9,
                                                                    in_stack_fffffffffffffcd8)))))))
                        );
    }
    in_stack_fffffffffffffcdb = uVar7;
    uVar7 = in_stack_fffffffffffffcdb;
    if ((bVar4 & 1) != 0) {
      QString::~QString((QString *)0x1038a4);
    }
    if ((bVar8 & 1) != 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    }
    if ((in_stack_fffffffffffffcdb & 1) != 0) break;
    bVar1 = QXmlStreamReader::isStartElement((QXmlStreamReader *)0x1038df);
    in_stack_fffffffffffffcef = 0;
    in_stack_fffffffffffffcee = 0;
    uVar6 = false;
    if (bVar1) {
      auVar5 = QXmlStreamReader::name();
      in_stack_fffffffffffffd10 = L"require";
      local_238 = auVar5;
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_278,(Data *)0x0,L"require",7);
      in_stack_fffffffffffffcef = 1;
      QString::QString((QString *)in_RDI,
                       (DataPointer *)
                       CONCAT17(in_stack_fffffffffffffcdf,
                                CONCAT16(in_stack_fffffffffffffcde,
                                         CONCAT15(bVar2,CONCAT14(uVar7,CONCAT13(
                                                  in_stack_fffffffffffffcdb,
                                                  CONCAT12(uVar6,CONCAT11(in_stack_fffffffffffffcd9,
                                                                          in_stack_fffffffffffffcd8)
                                                          )))))));
      in_stack_fffffffffffffcee = 1;
      QStringView::QStringView<QString,_true>
                ((QStringView *)
                 CONCAT17(bVar3,CONCAT16(bVar8,CONCAT15(bVar4,CONCAT14(in_stack_fffffffffffffcf4,
                                                                       in_stack_fffffffffffffcf0))))
                 ,(QString *)
                  CONCAT17(in_stack_fffffffffffffcef,CONCAT16(1,in_stack_fffffffffffffce8)));
      uVar6 = operator==((QStringView *)in_RDI,
                         (QStringView *)
                         CONCAT17(in_stack_fffffffffffffcdf,
                                  CONCAT16(in_stack_fffffffffffffcde,
                                           CONCAT15(bVar2,CONCAT14(uVar7,CONCAT13(
                                                  in_stack_fffffffffffffcdb,
                                                  CONCAT12(uVar6,CONCAT11(in_stack_fffffffffffffcd9,
                                                                          in_stack_fffffffffffffcd8)
                                                          )))))));
    }
    in_stack_fffffffffffffcd9 = uVar6;
    in_stack_fffffffffffffcda = in_stack_fffffffffffffcd9;
    if ((in_stack_fffffffffffffcee & 1) != 0) {
      QString::~QString((QString *)0x1039c2);
    }
    if ((in_stack_fffffffffffffcef & 1) != 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    }
    if (((in_stack_fffffffffffffcd9 & 1) != 0) && ((bVar3 & 1) != 0)) {
      parseFeatureRequire((VkSpecParser *)in_stack_fffffffffffffd10,(QString *)versionDefine);
    }
  }
  QString::~QString((QString *)0x103a17);
  QString::~QString((QString *)0x103a24);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VkSpecParser::parseFeature()
{
    // <feature api="vulkan" name="VK_VERSION_1_0" number="1.0" comment="Vulkan core API interface definitions">
    //   <require comment="Device initialization">

    QString api;
    QString versionName;
    for (const QXmlStreamAttribute &attr : m_reader.attributes()) {
        if (attr.name() == QStringLiteral("api"))
            api = attr.value().toString().trimmed();
        else if (attr.name() == QStringLiteral("name"))
            versionName = attr.value().toString().trimmed();
    }
    const bool isVulkan = api.split(',').contains(QStringLiteral("vulkan"));

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("feature"))
            return;
        if (m_reader.isStartElement() && m_reader.name() == QStringLiteral("require")) {
            if (isVulkan)
                parseFeatureRequire(versionName);
        }
    }
}